

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void * nn_msg_chunk_new(size_t size,nn_list *msg_array)

{
  nn_list_item *self;
  nn_list_item *it;
  void *pvVar1;
  
  self = (nn_list_item *)nn_alloc_(0x30);
  if (self != (nn_list_item *)0x0) {
    nn_chunkref_init((nn_chunkref *)(self + 1),size);
    nn_list_item_init(self);
    it = nn_list_end(msg_array);
    nn_list_insert(msg_array,self,it);
    pvVar1 = nn_chunkref_data((nn_chunkref *)(self + 1));
    return pvVar1;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
          ,0xd3);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void *nn_msg_chunk_new (size_t size, struct nn_list *msg_array)
{
    struct msg_chunk *self;

    self = nn_alloc (sizeof (struct msg_chunk), "msg_chunk");
    alloc_assert (self);

    nn_chunkref_init (&self->chunk, size);
    nn_list_item_init (&self->item);

    nn_list_insert (msg_array, &self->item, nn_list_end (msg_array));

    return nn_chunkref_data (&self->chunk);
}